

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O2

void __thiscall sc_dt::sc_uint_base::invalid_range(sc_uint_base *this,int l,int r)

{
  ostream *poVar1;
  char *local_1c0;
  stringstream msg;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar1 = std::operator<<(local_190,"sc_uint[_base] part selection: ");
  poVar1 = std::operator<<(poVar1,"left = ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,l);
  poVar1 = std::operator<<(poVar1,", right = ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,r);
  poVar1 = std::operator<<(poVar1," violates ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->m_len + -1);
  std::operator<<(poVar1," >= left >= right >= 0");
  std::__cxx11::stringbuf::str();
  sc_core::sc_report_handler::report
            (SC_ERROR,"out of bounds",local_1c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/datatypes/int/sc_uint_base.cpp"
             ,0x16e);
  std::__cxx11::string::_M_dispose();
  sc_core::sc_abort();
}

Assistant:

void
sc_uint_base::invalid_range( int l, int r ) const
{
    std::stringstream msg;
    msg << "sc_uint[_base] part selection: "
        << "left = " << l << ", right = " << r << " violates "
        << (m_len-1) << " >= left >= right >= 0";
    SC_REPORT_ERROR( sc_core::SC_ID_OUT_OF_BOUNDS_, msg.str().c_str() );
    sc_core::sc_abort(); // can't recover from here
}